

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
          (FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this,int i)

{
  undefined4 in_EDX;
  Fad<double> *in_RSI;
  Fad<Fad<double>_> *in_RDI;
  int in_stack_ffffffffffffff9c;
  Fad<double> *in_stack_ffffffffffffffd0;
  Fad<double> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  Fad<Fad<double>_>::fastAccessDx(in_RDI,in_stack_ffffffffffffff9c);
  Fad<Fad<double>_>::fastAccessDx(in_RDI,in_stack_ffffffffffffff9c);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>
            (in_RSI,(FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_RDI);
  return (value_type *)in_RDI;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}